

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadOneScopeInfo
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,ScopeInfo **scopeInfo)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  ScopeInfo *this_00;
  ScopeInfo *local_a0;
  ScopeInfo *parent;
  PropertyId local_90;
  bool hasParent;
  PropertyId obscuredPropertyId;
  SymbolInfoFlags symbolInfoFlags;
  SymbolInfo *sym;
  Type local_78;
  int i;
  int scopeType;
  ScopeInfoFlags scopeInfoFlags;
  undefined8 local_68;
  TrackAllocData local_60;
  FunctionInfo *local_38;
  FunctionInfo *functionInfo;
  LocalFunctionId relativeFunctionId;
  int symbolCount;
  ScopeInfo **scopeInfo_local;
  ByteCodeCache *cache_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  functionInfo._4_4_ = 0;
  _relativeFunctionId = scopeInfo;
  scopeInfo_local = (ScopeInfo **)cache;
  cache_local = (ByteCodeCache *)current;
  current_local = (byte *)this;
  cache_local = (ByteCodeCache *)ReadInt32(this,current,(int *)((long)&functionInfo + 4));
  functionInfo._0_4_ = 0;
  cache_local = (ByteCodeCache *)ReadUInt32(this,(byte *)cache_local,(uint *)&functionInfo);
  local_38 = ByteCodeCache::LookupFunctionInfo
                       ((ByteCodeCache *)scopeInfo_local,this->scriptContext,
                        (LocalFunctionId)functionInfo);
  if (local_38 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1182,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = ScriptContext::GetRecycler(this->scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&ScopeInfo::typeinfo,(long)(int)functionInfo._4_4_ << 4,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0x1184);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_60);
  _scopeType = Memory::Recycler::AllocZero;
  local_68 = 0;
  this_00 = (ScopeInfo *)new<Memory::Recycler>(0x30,pRVar5,0x473830,0);
  ScopeInfo::ScopeInfo(this_00,local_38,functionInfo._4_4_);
  *_relativeFunctionId = this_00;
  cache_local = (ByteCodeCache *)ReadByte(this,(byte *)cache_local,(byte *)((long)&i + 3));
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xfffe | (ushort)((i._3_1_ & 1) != 0);
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xfffd | (ushort)((i._3_1_ & 2) != 0) << 1;
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xfffb | (ushort)((i._3_1_ & 4) != 0) << 2;
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xfff7 | (ushort)((i._3_1_ & 8) != 0) << 3;
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xffdf |
       (ushort)((i._3_1_ & 0x10) != 0) << 5;
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xffbf |
       (ushort)((i._3_1_ & 0x20) != 0) << 6;
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xff7f |
       (ushort)((i._3_1_ & 0x40) != 0) << 7;
  *(ushort *)&(*_relativeFunctionId)->field_0x10 =
       *(ushort *)&(*_relativeFunctionId)->field_0x10 & 0xffef;
  cache_local = (ByteCodeCache *)ReadInt32(this,(byte *)cache_local,(int *)&local_78);
  (*_relativeFunctionId)->scopeType = local_78;
  cache_local = (ByteCodeCache *)
                ReadInt32(this,(byte *)cache_local,&(*_relativeFunctionId)->scopeId);
  if ((DAT_01ec73ca & 1) != 0) {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n",
                  (ulong)i._3_1_,(ulong)local_78,(ulong)(uint)(*_relativeFunctionId)->scopeId,
                  (ulong)functionInfo._4_4_);
  }
  for (sym._4_4_ = 0; sym._4_4_ < (int)functionInfo._4_4_; sym._4_4_ = sym._4_4_ + 1) {
    _obscuredPropertyId = &(*_relativeFunctionId)[1].parent + (long)sym._4_4_ * 2;
    cache_local = (ByteCodeCache *)ReadByte(this,(byte *)cache_local,&hasParent);
    *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) =
         *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) & 0xfe |
         (hasParent & 1U) != 0;
    *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) =
         *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) & 0xfd |
         ((hasParent & 2U) != 0) << 1;
    *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) =
         *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) & 0xfb |
         ((hasParent & 4U) != 0) << 2;
    *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) =
         *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) & 0xf7 |
         ((hasParent & 8U) != 0) << 3;
    *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) =
         *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) & 0xef |
         ((hasParent & 0x10U) != 0) << 4;
    *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) =
         *(byte *)((long)&((Type *)(_obscuredPropertyId + 1))->ptr + 1) & 0xdf |
         ((hasParent & 0x20U) != 0) << 5;
    cache_local = (ByteCodeCache *)
                  ReadByte(this,(byte *)cache_local,(byte *)(_obscuredPropertyId + 1));
    cache_local = (ByteCodeCache *)ReadInt32(this,(byte *)cache_local,&local_90);
    PVar3 = ByteCodeCache::LookupPropertyId((ByteCodeCache *)scopeInfo_local,local_90);
    *(PropertyId *)&_obscuredPropertyId->ptr = PVar3;
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(ByteCodeSerializationPhase,
                    L"\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n",(ulong)hasParent,
                    (ulong)*(byte *)&((Type *)(_obscuredPropertyId + 1))->ptr,
                    (ulong)*(uint *)&_obscuredPropertyId->ptr);
    }
  }
  parent._7_1_ = 0;
  cache_local = (ByteCodeCache *)ReadBool(this,(byte *)cache_local,(bool *)((long)&parent + 7));
  if ((parent._7_1_ & 1) != 0) {
    local_a0 = (ScopeInfo *)0x0;
    cache_local = (ByteCodeCache *)
                  ReadScopeInfo(this,(byte *)cache_local,(ByteCodeCache *)scopeInfo_local,&local_a0)
    ;
    Memory::WriteBarrierPtr<Js::ScopeInfo>::operator=(&(*_relativeFunctionId)->parent,local_a0);
  }
  return (byte *)cache_local;
}

Assistant:

const byte* ReadOneScopeInfo(const byte* current, ByteCodeCache* cache, ScopeInfo** scopeInfo)
    {
        int symbolCount = 0;
        current = ReadInt32(current, &symbolCount);

        Js::LocalFunctionId relativeFunctionId = 0;
        current = ReadUInt32(current, (uint*)&relativeFunctionId);
        FunctionInfo* functionInfo =  cache->LookupFunctionInfo(this->scriptContext, relativeFunctionId);

        Assert(functionInfo != nullptr);

        *scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(), symbolCount * sizeof(ScopeInfo::SymbolInfo), ScopeInfo, functionInfo, symbolCount);

        ScopeInfoFlags scopeInfoFlags;
        current = ReadByte(current, (byte*)&scopeInfoFlags);
        (*scopeInfo)->isDynamic = (scopeInfoFlags & sifIsDynamic) != 0;
        (*scopeInfo)->isObject = (scopeInfoFlags & sifIsObject) != 0;
        (*scopeInfo)->mustInstantiate = (scopeInfoFlags & sifMustInstantiate) != 0;
        (*scopeInfo)->isCached = (scopeInfoFlags & sifIsCached) != 0;
        (*scopeInfo)->hasLocalInClosure = (scopeInfoFlags & sifHasLocalInClosure) != 0;
        (*scopeInfo)->isGeneratorFunctionBody = (scopeInfoFlags & sifIsGeneratorFunctionBody) != 0;
        (*scopeInfo)->isAsyncFunctionBody = (scopeInfoFlags & sifIsAsyncFunctionBody) != 0;
        (*scopeInfo)->areNamesCached = false;

        int scopeType;
        current = ReadInt32(current, &scopeType);
        (*scopeInfo)->scopeType = (::ScopeType)scopeType;

        current = ReadInt32(current, &(*scopeInfo)->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n"), scopeInfoFlags, scopeType, (*scopeInfo)->scopeId, symbolCount);

        for (int i = 0; i < symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = (*scopeInfo)->symbols + i;

            SymbolInfoFlags symbolInfoFlags;
            current = ReadByte(current, (byte*)&symbolInfoFlags);
            sym->hasFuncAssignment = (symbolInfoFlags & syifHasFuncAssignment) != 0;
            sym->isBlockVariable = (symbolInfoFlags & syifIsBlockVariable) != 0;
            sym->isConst = (symbolInfoFlags & syifIsConst) != 0;
            sym->isFuncExpr = (symbolInfoFlags & syifIsFuncExpr) != 0;
            sym->isModuleExportStorage = (symbolInfoFlags & syifIsModuleExportStorage) != 0;
            sym->isModuleImport = (symbolInfoFlags & syifIsModuleImport) != 0;

            current = ReadByte(current, (BYTE*)&sym->symbolType);

            PropertyId obscuredPropertyId;
            current = ReadInt32(current, (int*)&obscuredPropertyId);
            sym->propertyId = cache->LookupPropertyId(obscuredPropertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n"), symbolInfoFlags, sym->symbolType, sym->propertyId);
        }

        bool hasParent = false;
        current = ReadBool(current, &hasParent);

        if (hasParent)
        {
            ScopeInfo* parent = nullptr;
            current = ReadScopeInfo(current, cache, &parent);
            (*scopeInfo)->parent = parent;
        }

        return current;
    }